

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicsLinearization.cpp
# Opt level: O1

void iDynTree::ForwardDynamicsLinearizationWrtBaseTwist
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,LinkNetExternalWrenches *linkExtWrenches,
               JointDOFsDoubleArray *jointTorques,ForwardDynamicsLinearizationInternalBuffers *bufs,
               FreeFloatingAcc *robotAcc,FreeFloatingStateLinearization *A)

{
  DOFSpatialForceArray *this;
  double *pdVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  pointer pSVar8;
  pointer pMVar9;
  pointer pSVar10;
  pointer pSVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  pointer pSVar43;
  undefined8 uVar44;
  Model *pMVar45;
  uint uVar46;
  int iVar47;
  PointerType ptr;
  LinkPositions *this_00;
  Link *pLVar48;
  LinkIndex LVar49;
  IJoint *pIVar50;
  LinkIndex LVar51;
  JointPosDoubleArray *pJVar52;
  undefined4 extraout_var;
  Transform *pTVar53;
  undefined4 extraout_var_00;
  VectorDynSize *this_01;
  undefined4 extraout_var_01;
  ArticulatedBodyInertia *pAVar54;
  double *pdVar55;
  SpatialMotionVector *pSVar56;
  SpatialForceVector *pSVar57;
  undefined4 extraout_var_02;
  long *plVar58;
  size_t sVar59;
  size_t sVar60;
  size_t sVar61;
  undefined8 *puVar62;
  long lVar63;
  long lVar64;
  double *pdVar65;
  ulong uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined4 uVar71;
  undefined4 uVar72;
  type tmp;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  Matrix6x6 dVb_pa;
  ArticulatedBodyInertia Ia;
  assign_op<double,_double> local_5f1;
  FreeFloatingPos *local_5f0;
  VectorDynSize *local_5e8;
  Traversal *local_5d8;
  Model *local_5d0;
  LinkArticulatedBodyInertias *local_5c8;
  undefined8 uStack_5c0;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> local_5b8;
  undefined1 local_5a8 [72];
  pointer pSStack_560;
  double local_558 [2];
  undefined1 local_548 [16];
  LinkArticulatedBodyInertias *local_538;
  double dStack_530;
  double local_528 [4];
  double local_508;
  double dStack_500;
  double local_4f8 [4];
  double local_4d8;
  double dStack_4d0;
  double local_4c8 [4];
  double local_4a8;
  double dStack_4a0;
  double local_498 [2];
  Matrix<double,_6,_1,_0,_6,_1> local_488;
  Scalar local_458 [6];
  undefined1 local_428;
  LinkArticulatedBodyInertias *local_410;
  VectorDynSize *local_408;
  DOFSpatialForceArray *local_400;
  long local_3f8;
  pointer local_3f0;
  undefined1 local_3e8 [32];
  pointer apSStack_3c8 [4];
  undefined1 local_3a8 [8];
  pointer pSStack_3a0;
  double *pdStack_398;
  PointerType pdStack_390;
  double dStack_388;
  pointer pSStack_380;
  pointer local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_268;
  double dStack_260;
  double local_258;
  undefined8 uStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  double *local_218;
  PointerType pdStack_210;
  double local_208;
  pointer pSStack_200;
  pointer local_1f8;
  double dStack_1f0;
  LhsNested local_1e8;
  pointer pMStack_1e0;
  double local_1d8;
  double dStack_1d0;
  scalar_constant_op<double> local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_108 [6];
  
  local_5f0 = robotPos;
  local_5d0 = model;
  uVar46 = Traversal::getNrOfVisitedLinks(traversal);
  local_5d8 = traversal;
  if (uVar46 != 0) {
    this_00 = &bufs->linkPos;
    uVar66 = 0;
    do {
      pLVar48 = Traversal::getLink(traversal,uVar66);
      LVar49 = Link::getIndex(pLVar48);
      pLVar48 = Traversal::getParentLink(traversal,uVar66);
      pIVar50 = Traversal::getParentJoint(traversal,uVar66);
      if (pLVar48 == (Link *)0x0) {
        iDynTree::Transform::Identity();
        pTVar53 = LinkPositions::operator()(this_00,LVar49);
        iDynTree::Transform::operator=(pTVar53,(Transform *)local_5a8);
        memset((bufs->dVb_linkBiasAcceleration).
               super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
               ._M_impl.super__Vector_impl_data._M_start + LVar49,0,0x120);
      }
      else {
        LVar51 = Link::getIndex(pLVar48);
        pJVar52 = FreeFloatingPos::jointPos(local_5f0);
        Link::getIndex(pLVar48);
        iVar47 = (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar49);
        LinkPositions::operator()(this_00,LVar51);
        iDynTree::Transform::operator*
                  ((Transform *)local_5a8,(Transform *)CONCAT44(extraout_var,iVar47));
        pTVar53 = LinkPositions::operator()(this_00,LVar49);
        iDynTree::Transform::operator=(pTVar53,(Transform *)local_5a8);
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 == 0) {
          memset((bufs->dVb_linkBiasAcceleration).
                 super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                 ._M_impl.super__Vector_impl_data._M_start + LVar49,0,0x120);
        }
        else {
          iVar47 = (*pIVar50->_vptr_IJoint[0x18])(pIVar50);
          this_01 = &FreeFloatingVel::jointVel(robotVel)->super_VectorDynSize;
          local_5e8 = (VectorDynSize *)
                      iDynTree::VectorDynSize::operator()(this_01,CONCAT44(extraout_var_00,iVar47));
          DOFSpatialMotionArray::operator()
                    ((DOFSpatialMotionArray *)bufs,CONCAT44(extraout_var_00,iVar47));
          iDynTree::SpatialMotionVector::operator*
                    ((SpatialMotionVector *)local_228,-(double)local_5e8);
          iDynTree::SpatialMotionVector::asCrossProductMatrix();
          LinkPositions::operator()(this_00,LVar49);
          iDynTree::Transform::asAdjointTransform();
          local_3e8._0_8_ =
               (bufs->dVb_linkBiasAcceleration).
               super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
               ._M_impl.super__Vector_impl_data._M_start + LVar49;
          local_108[0].m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)local_5a8;
          local_108[0].m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)local_3a8;
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
                    ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_3e8
                     ,local_108,(assign_op<double,_double> *)&local_5b8,(type)0x0);
        }
      }
      pSVar8 = (bufs->dVl_linkLocalBiasWrench).
               super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
               ._M_impl.super__Vector_impl_data._M_start;
      LinkPositions::operator()(this_00,LVar49);
      iDynTree::Transform::asAdjointTransform();
      local_228._0_8_ =
           (bufs->dVb_linkBiasWrench).
           super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
           ._M_impl.super__Vector_impl_data._M_start + LVar49;
      local_3a8 = (undefined1  [8])(pSVar8 + LVar49);
      pdStack_398 = (double *)local_5a8;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
                ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_228,
                 (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)local_3a8,(assign_op<double,_double> *)local_108,(type)0x0);
      traversal = local_5d8;
      uVar66 = uVar66 + 1;
      uVar46 = Traversal::getNrOfVisitedLinks(local_5d8);
    } while (uVar66 < uVar46);
  }
  uVar46 = Traversal::getNrOfVisitedLinks(traversal);
  if (-1 < (int)(uVar46 - 1)) {
    local_5c8 = &(bufs->aba).linkABIs;
    this = &(bufs->aba).U;
    local_5e8 = &(bufs->aba).D.super_VectorDynSize;
    uVar66 = (ulong)(uVar46 - 1);
    do {
      pLVar48 = Traversal::getLink(traversal,uVar66);
      LVar49 = Link::getIndex(pLVar48);
      pLVar48 = Traversal::getParentLink(traversal,uVar66);
      pIVar50 = Traversal::getParentJoint(traversal,uVar66);
      if (pLVar48 != (Link *)0x0) {
        iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia
                  ((ArticulatedBodyInertia *)local_108);
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 != 0) {
          iVar47 = (*pIVar50->_vptr_IJoint[0x18])(pIVar50);
          sVar61 = CONCAT44(extraout_var_01,iVar47);
          pAVar54 = LinkArticulatedBodyInertias::operator()(local_5c8,LVar49);
          DOFSpatialForceArray::operator()(this,sVar61);
          pdVar55 = (double *)iDynTree::VectorDynSize::operator()(local_5e8,sVar61);
          iDynTree::ArticulatedBodyInertia::ABADyadHelper((SpatialForceVector *)local_3a8,*pdVar55);
          iDynTree::ArticulatedBodyInertia::operator-((ArticulatedBodyInertia *)local_5a8,pAVar54);
          memcpy(local_108,(ArticulatedBodyInertia *)local_5a8,0xd8);
          pSVar56 = DOFSpatialMotionArray::operator()((DOFSpatialMotionArray *)bufs,sVar61);
          local_3a8 = (undefined1  [8])
                      (pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                      super_Vector3.m_data[2];
          pSStack_3a0 = (pointer)(pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).
                                 angularVec3.super_Vector3.m_data[0];
          pdStack_398 = (double *)
                        (pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                        super_Vector3.m_data[1];
          pdStack_390 = (PointerType)
                        (pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                        super_Vector3.m_data[2];
          pSVar8 = (bufs->dVb_linkBiasWrench).
                   super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar9 = (bufs->dVb_u).
                   super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5a8._48_8_ = pSVar8 + LVar49;
          local_5a8._0_8_ =
               -(pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                super_Vector3.m_data[0];
          local_5a8._8_8_ =
               -(pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                super_Vector3.m_data[1];
          local_5a8._16_8_ = -(double)local_3a8;
          local_5a8._24_8_ = -(double)pSStack_3a0;
          local_5a8._32_8_ = -(double)pdStack_398;
          local_5a8._40_8_ = -(double)pdStack_390;
          pSStack_560 = (pointer)local_5a8._48_8_;
          local_5a8._64_8_ = (ArticulatedBodyInertia *)local_5a8;
          local_558[1] = 2.96439387504748e-323;
          dVar14 = pSVar8[LVar49].super_Matrix6x6.m_data[1];
          pdVar55 = pSVar8[LVar49].super_Matrix6x6.m_data + 2;
          dVar15 = *pdVar55;
          dVar17 = pdVar55[1];
          pdVar55 = pSVar8[LVar49].super_Matrix6x6.m_data + 4;
          dVar18 = *pdVar55;
          dVar6 = pdVar55[1];
          pdVar55 = pSVar8[LVar49].super_Matrix6x6.m_data + 6;
          dVar7 = pdVar55[1];
          pdVar65 = pSVar8[LVar49].super_Matrix6x6.m_data + 0xc;
          dVar19 = pdVar65[1];
          pdVar3 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x12;
          dVar20 = pdVar3[1];
          pdVar4 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x18;
          dVar21 = pdVar4[1];
          pdVar5 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x1e;
          dVar22 = pdVar5[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 8;
          dVar23 = *pdVar1;
          dVar24 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0xe;
          dVar25 = *pdVar1;
          dVar26 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x14;
          dVar27 = *pdVar1;
          dVar28 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x1a;
          dVar29 = *pdVar1;
          dVar30 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x20;
          dVar31 = *pdVar1;
          dVar32 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 10;
          dVar33 = *pdVar1;
          dVar34 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x10;
          dVar35 = *pdVar1;
          dVar36 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x16;
          dVar37 = *pdVar1;
          dVar38 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x1c;
          dVar39 = *pdVar1;
          dVar40 = pdVar1[1];
          pdVar1 = pSVar8[LVar49].super_Matrix6x6.m_data + 0x22;
          dVar41 = *pdVar1;
          dVar42 = pdVar1[1];
          pMVar9[sVar61].m_data[0] =
               *pdVar5 * (double)local_5a8._40_8_ +
               *pdVar4 * (double)local_5a8._32_8_ +
               *pdVar3 * (double)local_5a8._24_8_ +
               *pdVar65 * (double)local_5a8._16_8_ +
               *pdVar55 * (double)local_5a8._8_8_ +
               pSVar8[LVar49].super_Matrix6x6.m_data[0] * (double)local_5a8._0_8_;
          pMVar9[sVar61].m_data[1] =
               dVar22 * (double)local_5a8._40_8_ +
               dVar21 * (double)local_5a8._32_8_ +
               dVar20 * (double)local_5a8._24_8_ +
               dVar19 * (double)local_5a8._16_8_ +
               dVar7 * (double)local_5a8._8_8_ + dVar14 * (double)local_5a8._0_8_;
          pMVar9[sVar61].m_data[2] =
               dVar31 * (double)local_5a8._40_8_ +
               dVar29 * (double)local_5a8._32_8_ +
               dVar27 * (double)local_5a8._24_8_ +
               dVar25 * (double)local_5a8._16_8_ +
               dVar23 * (double)local_5a8._8_8_ + dVar15 * (double)local_5a8._0_8_;
          (pMVar9[sVar61].m_data + 2)[1] =
               dVar32 * (double)local_5a8._40_8_ +
               dVar30 * (double)local_5a8._32_8_ +
               dVar28 * (double)local_5a8._24_8_ +
               dVar26 * (double)local_5a8._16_8_ +
               dVar24 * (double)local_5a8._8_8_ + dVar17 * (double)local_5a8._0_8_;
          pMVar9[sVar61].m_data[4] =
               dVar41 * (double)local_5a8._40_8_ +
               dVar39 * (double)local_5a8._32_8_ +
               dVar37 * (double)local_5a8._24_8_ +
               dVar35 * (double)local_5a8._16_8_ +
               dVar33 * (double)local_5a8._8_8_ + dVar18 * (double)local_5a8._0_8_;
          (pMVar9[sVar61].m_data + 4)[1] =
               dVar42 * (double)local_5a8._40_8_ +
               dVar40 * (double)local_5a8._32_8_ +
               dVar38 * (double)local_5a8._24_8_ +
               dVar36 * (double)local_5a8._16_8_ +
               dVar34 * (double)local_5a8._8_8_ + dVar6 * (double)local_5a8._0_8_;
          pSVar8 = (bufs->dVb_linkBiasWrench).
                   super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iDynTree::ArticulatedBodyInertia::asMatrix();
          pSVar10 = (bufs->dVb_linkBiasAcceleration).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar57 = DOFSpatialForceArray::operator()(this,sVar61);
          local_3e8._0_8_ = *(undefined8 *)(pSVar57 + 8);
          local_3e8._8_8_ = *(undefined8 *)(pSVar57 + 0x10);
          local_3e8._16_8_ = *(undefined8 *)(pSVar57 + 0x18);
          local_3e8._24_8_ = *(undefined8 *)(pSVar57 + 0x20);
          apSStack_3c8[0] = *(pointer *)(pSVar57 + 0x28);
          apSStack_3c8[1] = *(pointer *)(pSVar57 + 0x30);
          pMVar9 = (bufs->dVb_u).
                   super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar55 = (double *)iDynTree::VectorDynSize::operator()(local_5e8,sVar61);
          local_1c8.m_other = *pdVar55;
          pdStack_210 = (PointerType)local_5a8;
          local_1e8 = (LhsNested)local_3e8;
          local_5b8._0_8_ = local_3a8;
          local_228._8_8_ = pSVar8 + LVar49;
          pSStack_200 = pSVar10 + LVar49;
          pMStack_1e0 = pMVar9 + sVar61;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>const>const>const>,Eigen::internal::assign_op<double,double>>
                    (&local_5b8,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>_>
                      *)local_228,&local_5f1);
        }
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 == 0) {
          pAVar54 = LinkArticulatedBodyInertias::operator()(local_5c8,LVar49);
          memcpy(local_108,pAVar54,0xd8);
          pSVar8 = (bufs->dVb_linkBiasWrench).
                   super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iDynTree::ArticulatedBodyInertia::asMatrix();
          apSStack_3c8[0] =
               (bufs->dVb_linkBiasAcceleration).
               super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
               ._M_impl.super__Vector_impl_data._M_start + LVar49;
          local_3e8._0_8_ = (pointer)(pSVar8 + LVar49);
          local_3e8._16_8_ = local_228;
          Eigen::internal::
          assignment_from_xpr_op_product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,_6,_6,_1,_6,_6> *)local_5a8,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)local_3e8,(assign_op<double,_double> *)&local_5b8);
          local_3a8 = (undefined1  [8])local_5a8._0_8_;
          pSStack_3a0 = (pointer)local_5a8._8_8_;
          pdStack_398 = (double *)local_5a8._16_8_;
          pdStack_390 = (PointerType)local_5a8._24_8_;
          dStack_388 = (double)local_5a8._32_8_;
          pSStack_380 = (pointer)local_5a8._40_8_;
          local_378 = (pointer)local_5a8._48_8_;
          dStack_370 = (double)local_5a8._56_8_;
          local_368 = (double)local_5a8._64_8_;
          dStack_360 = (double)pSStack_560;
          local_358 = local_558[0];
          dStack_350 = local_558[1];
          local_348 = (double)local_548._0_8_;
          dStack_340 = (double)local_548._8_8_;
          local_338 = (double)local_538;
          dStack_330 = dStack_530;
          local_328 = local_528[0];
          dStack_320 = local_528[1];
          local_318 = local_528[2];
          dStack_310 = local_528[3];
          local_308 = local_508;
          dStack_300 = dStack_500;
          local_2f8 = local_4f8[0];
          dStack_2f0 = local_4f8[1];
          local_2e8 = local_4f8[2];
          dStack_2e0 = local_4f8[3];
          local_2d8 = local_4d8;
          dStack_2d0 = dStack_4d0;
          local_2c8 = local_4c8[0];
          dStack_2c0 = local_4c8[1];
          local_2b8 = local_4c8[2];
          dStack_2b0 = local_4c8[3];
          local_2a8 = local_4a8;
          dStack_2a0 = dStack_4a0;
          local_298 = local_498[0];
          dStack_290 = local_498[1];
        }
        LVar49 = Link::getIndex(pLVar48);
        pJVar52 = FreeFloatingPos::jointPos(local_5f0);
        (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar49);
        iDynTree::Transform::asAdjointTransformWrench();
        local_218 = (double *)local_3a8;
        local_3e8._0_8_ =
             (bufs->dVb_linkBiasWrench).
             super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
             ._M_impl.super__Vector_impl_data._M_start + LVar49;
        local_228._0_8_ = (pointer)local_5a8;
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::add_assign_op<double,double>>
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_3e8,
                   (Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
                    *)local_228,(add_assign_op<double,_double> *)&local_5b8,(type)0x0);
      }
      bVar12 = 0 < (long)uVar66;
      traversal = local_5d8;
      uVar66 = uVar66 - 1;
    } while (bVar12);
  }
  uVar46 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar46 != 0) {
    local_400 = &(bufs->aba).U;
    local_408 = &(bufs->aba).D.super_VectorDynSize;
    local_410 = &(bufs->aba).linkABIs;
    uVar66 = 0;
    do {
      pLVar48 = Traversal::getLink(traversal,uVar66);
      LVar49 = Link::getIndex(pLVar48);
      pLVar48 = Traversal::getParentLink(traversal,uVar66);
      pIVar50 = Traversal::getParentJoint(traversal,uVar66);
      if (pLVar48 == (Link *)0x0) {
        LinkArticulatedBodyInertias::operator()(local_410,LVar49);
        iDynTree::ArticulatedBodyInertia::asMatrix();
        local_428 = 0;
        local_5a8._0_8_ = local_228._0_8_;
        local_5a8._8_8_ = local_228._8_8_;
        local_5a8._16_8_ = local_218;
        local_5a8._24_8_ = pdStack_210;
        local_5a8._32_8_ = local_208;
        local_5a8._40_8_ = pSStack_200;
        local_5a8._48_8_ = local_1f8;
        local_5a8._56_8_ = dStack_1f0;
        pSStack_560 = (pointer)pMStack_1e0;
        local_5a8._64_8_ = local_1e8;
        local_558[0] = local_1d8;
        local_558[1] = dStack_1d0;
        local_548._8_8_ = uStack_1c0;
        local_548._0_8_ = local_1c8.m_other;
        local_538 = (LinkArticulatedBodyInertias *)local_1b8;
        dStack_530 = dStack_1b0;
        local_528[0] = local_1a8;
        local_528[1] = dStack_1a0;
        local_528[2] = local_198;
        local_528[3] = dStack_190;
        local_508 = local_188;
        dStack_500 = dStack_180;
        local_4f8[0] = local_178;
        local_4f8[1] = dStack_170;
        local_4f8[2] = local_168;
        local_4f8[3] = dStack_160;
        local_4d8 = local_158;
        dStack_4d0 = dStack_150;
        local_4c8[0] = local_148;
        local_4c8[1] = dStack_140;
        local_4c8[2] = local_138;
        local_4c8[3] = dStack_130;
        local_4a8 = local_128;
        dStack_4a0 = dStack_120;
        local_498[0] = local_118;
        local_498[1] = dStack_110;
        Eigen::internal::
        householder_qr_inplace_blocked<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_double,_true>
        ::run((Matrix<double,_6,_6,_1,_6,_6> *)local_5a8,&local_488,0x30,local_458);
        local_428 = 1;
        local_108[0].m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)
                  ((bufs->dVb_linkBiasWrench).
                   super__Vector_base<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                   ._M_impl.super__Vector_impl_data._M_start + LVar49);
        pSVar10 = (bufs->dVb_linksAccelerations).
                  super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdStack_398 = &dStack_388;
        Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>::
        _solve_impl<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,6,6,1,6,6>>
                  ((HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>> *)local_5a8,
                   (Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_108,
                   (Matrix<double,_6,_6,_1,_6,_6> *)pdStack_398);
        dVar14 = pdStack_398[1];
        pSVar10[LVar49].super_Matrix6x6.m_data[0] = -*pdStack_398;
        pSVar10[LVar49].super_Matrix6x6.m_data[1] = -dVar14;
        dVar14 = pdStack_398[3];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 2;
        *pdVar55 = -pdStack_398[2];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[5];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 4;
        *pdVar55 = -pdStack_398[4];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[7];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 6;
        *pdVar55 = -pdStack_398[6];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[9];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 8;
        *pdVar55 = -pdStack_398[8];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0xb];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 10;
        *pdVar55 = -pdStack_398[10];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0xd];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0xc;
        *pdVar55 = -pdStack_398[0xc];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0xf];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0xe;
        *pdVar55 = -pdStack_398[0xe];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x11];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x10;
        *pdVar55 = -pdStack_398[0x10];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x13];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x12;
        *pdVar55 = -pdStack_398[0x12];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x15];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x14;
        *pdVar55 = -pdStack_398[0x14];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x17];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x16;
        *pdVar55 = -pdStack_398[0x16];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x19];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x18;
        *pdVar55 = -pdStack_398[0x18];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x1b];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1a;
        *pdVar55 = -pdStack_398[0x1a];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x1d];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1c;
        *pdVar55 = -pdStack_398[0x1c];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x1f];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1e;
        *pdVar55 = -pdStack_398[0x1e];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x21];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x20;
        *pdVar55 = -pdStack_398[0x20];
        pdVar55[1] = -dVar14;
        dVar14 = pdStack_398[0x23];
        pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x22;
        *pdVar55 = -pdStack_398[0x22];
        pdVar55[1] = -dVar14;
        pSVar10 = (bufs->dVb_linksAccelerations).
                  super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar63 = iDynTree::MatrixDynSize::data();
        iDynTree::MatrixDynSize::rows();
        lVar64 = iDynTree::MatrixDynSize::cols();
        pMVar45 = local_5d0;
        sVar61 = Model::getNrOfDOFs(local_5d0);
        sVar59 = Model::getNrOfDOFs(pMVar45);
        puVar62 = (undefined8 *)(lVar63 + sVar59 * 8 + (sVar61 + 6) * lVar64 * 8 + 0x50);
        lVar63 = 0x20;
        do {
          puVar2 = (undefined8 *)((long)pSVar10[LVar49].super_Matrix6x6.m_data + lVar63 + -0x20);
          uVar44 = puVar2[1];
          puVar62[-4] = *puVar2;
          puVar62[-3] = uVar44;
          puVar2 = (undefined8 *)((long)pSVar10[LVar49].super_Matrix6x6.m_data + lVar63 + -0x10);
          uVar44 = puVar2[1];
          puVar62[-2] = *puVar2;
          puVar62[-1] = uVar44;
          puVar2 = (undefined8 *)((long)pSVar10[LVar49].super_Matrix6x6.m_data + lVar63);
          uVar44 = puVar2[1];
          *puVar62 = *puVar2;
          puVar62[1] = uVar44;
          lVar63 = lVar63 + 0x30;
          puVar62 = puVar62 + lVar64;
        } while (lVar63 != 0x140);
      }
      else {
        LVar51 = Link::getIndex(pLVar48);
        iVar47 = (*pIVar50->_vptr_IJoint[4])(pIVar50);
        if (iVar47 == 0) {
          pJVar52 = FreeFloatingPos::jointPos(local_5f0);
          (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar49,LVar51);
          iDynTree::Transform::asAdjointTransform();
          pSVar10 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[4] = (double)((bufs->dVb_linkBiasAcceleration).
                              super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                              ._M_impl.super__Vector_impl_data._M_start + LVar49);
          pdVar55 = (double *)(local_5a8 + 0x20);
          local_5a8._16_8_ = pdVar55;
          lVar63 = 0;
          do {
            lVar64 = 5;
            pdVar65 = pdVar55;
            do {
              *pdVar65 = pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0x1e] *
                         (double)(&pSStack_3a0)[lVar64 + -1] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0x18] *
                         (double)apSStack_3c8[lVar64 + 3] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0x12] *
                         (double)apSStack_3c8[lVar64 + 2] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0xc] *
                         (double)apSStack_3c8[lVar64 + 1] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 6] *
                         (double)apSStack_3c8[lVar64] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63] *
                         (double)apSStack_3c8[lVar64 + -1];
              lVar64 = lVar64 + 6;
              pdVar65 = pdVar65 + 1;
            } while (lVar64 != 0x29);
            lVar63 = lVar63 + 1;
            pdVar55 = pdVar55 + 6;
          } while (lVar63 != 6);
          lVar63 = 5;
          pdVar55 = (double *)(local_5a8 + 0x20);
          do {
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -5] =
                 *pdVar55 +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -5];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -4] =
                 pdVar55[6] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -4];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -3] =
                 pdVar55[0xc] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -3];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -2] =
                 pdVar55[0x12] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -2];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -1] =
                 pdVar55[0x18] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -1];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63] =
                 pdVar55[0x1e] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63];
            lVar63 = lVar63 + 6;
            pdVar55 = pdVar55 + 1;
          } while (lVar63 != 0x29);
        }
        else {
          iVar47 = (*pIVar50->_vptr_IJoint[0x18])(pIVar50);
          sVar61 = CONCAT44(extraout_var_02,iVar47);
          pJVar52 = FreeFloatingPos::jointPos(local_5f0);
          (*pIVar50->_vptr_IJoint[10])(pIVar50,pJVar52,LVar49,LVar51);
          iDynTree::Transform::asAdjointTransform();
          pSVar10 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[4] = (double)((bufs->dVb_linkBiasAcceleration).
                              super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                              ._M_impl.super__Vector_impl_data._M_start + LVar49);
          pdVar55 = (double *)(local_5a8 + 0x20);
          local_5a8._16_8_ = pdVar55;
          lVar63 = 0;
          do {
            lVar64 = 5;
            pdVar65 = pdVar55;
            do {
              *pdVar65 = pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0x1e] *
                         (double)(&pSStack_3a0)[lVar64 + -1] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0x18] *
                         (double)apSStack_3c8[lVar64 + 3] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0x12] *
                         (double)apSStack_3c8[lVar64 + 2] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 0xc] *
                         (double)apSStack_3c8[lVar64 + 1] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63 + 6] *
                         (double)apSStack_3c8[lVar64] +
                         pSVar10[LVar51].super_Matrix6x6.m_data[lVar63] *
                         (double)apSStack_3c8[lVar64 + -1];
              lVar64 = lVar64 + 6;
              pdVar65 = pdVar65 + 1;
            } while (lVar64 != 0x29);
            lVar63 = lVar63 + 1;
            pdVar55 = pdVar55 + 6;
          } while (lVar63 != 6);
          lVar63 = 5;
          pdVar55 = (double *)(local_5a8 + 0x20);
          do {
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -5] =
                 *pdVar55 +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -5];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -4] =
                 pdVar55[6] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -4];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -3] =
                 pdVar55[0xc] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -3];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -2] =
                 pdVar55[0x12] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -2];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63 + -1] =
                 pdVar55[0x18] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63 + -1];
            pSVar10[LVar49].super_Matrix6x6.m_data[lVar63] =
                 pdVar55[0x1e] +
                 (((pointer)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4])->super_Matrix6x6).m_data[lVar63];
            lVar63 = lVar63 + 6;
            pdVar55 = pdVar55 + 1;
          } while (lVar63 != 0x29);
          pMVar9 = (bufs->dVb_u).
                   super__Vector_base<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5e8 = (VectorDynSize *)(sVar61 * 0x30);
          local_3f0 = pMVar9 + sVar61;
          pSVar57 = DOFSpatialForceArray::operator()(local_400,sVar61);
          local_268 = *(double *)(pSVar57 + 8);
          dStack_260 = *(double *)(pSVar57 + 0x10);
          local_258 = *(double *)(pSVar57 + 0x18);
          uStack_250 = *(undefined8 *)(pSVar57 + 0x20);
          local_248 = *(double *)(pSVar57 + 0x20);
          dStack_240 = *(double *)(pSVar57 + 0x28);
          pSVar10 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_238 = *(double *)(pSVar57 + 0x30);
          uStack_230 = 0;
          plVar58 = (long *)iDynTree::VectorDynSize::operator()(local_408,sVar61);
          local_5c8 = (LinkArticulatedBodyInertias *)*plVar58;
          uStack_5c0 = 0;
          local_3f8 = iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          lVar64 = iDynTree::MatrixDynSize::cols();
          pMVar45 = local_5d0;
          sVar59 = Model::getNrOfDOFs(local_5d0);
          sVar60 = Model::getNrOfDOFs(pMVar45);
          lVar63 = local_3f8 + sVar60 * 8;
          lVar64 = (sVar61 + sVar59 + 0xc) * lVar64;
          local_5a8._24_8_ = local_3f0;
          local_5a8._48_8_ = local_5a8 + 0x40;
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 6;
          pdVar65 = pSVar10[LVar49].super_Matrix6x6.m_data + 0xc;
          pdVar1 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x12;
          pdVar3 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x18;
          pdVar4 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1e;
          dVar14 = *pdVar4 * local_238 +
                   *pdVar3 * dStack_240 +
                   *pdVar1 * local_248 +
                   *pdVar65 * local_258 +
                   *pdVar55 * dStack_260 + pSVar10[LVar49].super_Matrix6x6.m_data[0] * local_268;
          dVar15 = pdVar4[1] * local_238 +
                   pdVar3[1] * dStack_240 +
                   pdVar1[1] * local_248 +
                   pdVar65[1] * local_258 +
                   pdVar55[1] * dStack_260 + pSVar10[LVar49].super_Matrix6x6.m_data[1] * local_268;
          unique0x1000054e = SUB84(dVar15,0);
          local_5a8._64_8_ = dVar14;
          unique0x10000552 = (int)((ulong)dVar15 >> 0x20);
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 2;
          pdVar65 = pSVar10[LVar49].super_Matrix6x6.m_data + 8;
          pdVar1 = pSVar10[LVar49].super_Matrix6x6.m_data + 0xe;
          pdVar3 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x14;
          pdVar4 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1a;
          pdVar5 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x20;
          local_558[0] = *pdVar5 * local_238 +
                         *pdVar4 * dStack_240 +
                         *pdVar3 * local_248 +
                         *pdVar1 * local_258 + *pdVar65 * dStack_260 + *pdVar55 * local_268;
          local_558[1] = pdVar5[1] * local_238 +
                         pdVar4[1] * dStack_240 +
                         pdVar3[1] * local_248 +
                         pdVar1[1] * local_258 + pdVar65[1] * dStack_260 + pdVar55[1] * local_268;
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 4;
          pdVar65 = pSVar10[LVar49].super_Matrix6x6.m_data + 10;
          pdVar1 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x10;
          pdVar3 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x16;
          pdVar4 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1c;
          pdVar5 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x22;
          dVar17 = *pdVar5 * local_238 +
                   *pdVar4 * dStack_240 +
                   *pdVar3 * local_248 +
                   *pdVar1 * local_258 + *pdVar65 * dStack_260 + *pdVar55 * local_268;
          dVar18 = pdVar5[1] * local_238 +
                   pdVar4[1] * dStack_240 +
                   pdVar3[1] * local_248 +
                   pdVar1[1] * local_258 + pdVar65[1] * dStack_260 + pdVar55[1] * local_268;
          local_548._8_4_ = SUB84(dVar18,0);
          local_548._0_8_ = dVar17;
          local_548._12_4_ = (int)((ulong)dVar18 >> 0x20);
          local_538 = local_5c8;
          pdVar55 = (double *)((long)pMVar9->m_data + (long)local_5e8);
          auVar67._0_8_ = *pdVar55 - dVar14;
          auVar67._8_8_ = pdVar55[1] - dVar15;
          uVar71 = SUB84(local_5c8,0);
          uVar72 = (undefined4)((ulong)local_5c8 >> 0x20);
          auVar16._8_4_ = uVar71;
          auVar16._0_8_ = local_5c8;
          auVar16._12_4_ = uVar72;
          auVar68 = divpd(auVar67,auVar16);
          *(undefined1 (*) [16])(lVar63 + 0x30 + lVar64 * 8) = auVar68;
          auVar69._0_8_ = local_3f0->m_data[2] - local_558[0];
          auVar69._8_8_ = local_3f0->m_data[3] - local_558[1];
          auVar68._8_4_ = uVar71;
          auVar68._0_8_ = local_5c8;
          auVar68._12_4_ = uVar72;
          auVar68 = divpd(auVar69,auVar68);
          *(undefined1 (*) [16])(lVar63 + 0x40 + lVar64 * 8) = auVar68;
          auVar70._0_8_ = local_3f0->m_data[4] - dVar17;
          auVar70._8_8_ = local_3f0->m_data[5] - (double)local_548._8_8_;
          auVar13._8_4_ = uVar71;
          auVar13._0_8_ = local_5c8;
          auVar13._12_4_ = uVar72;
          auVar68 = divpd(auVar70,auVar13);
          *(undefined1 (*) [16])(lVar63 + 0x50 + lVar64 * 8) = auVar68;
          pSVar10 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar56 = DOFSpatialMotionArray::operator()((DOFSpatialMotionArray *)bufs,sVar61);
          local_3a8 = (undefined1  [8])
                      (pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                      super_Vector3.m_data[0];
          pSStack_3a0 = (pointer)(pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).
                                 linearVec3.super_Vector3.m_data[1];
          pdStack_398 = (double *)
                        (pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                        super_Vector3.m_data[2];
          pdStack_390 = (PointerType)
                        (pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                        super_Vector3.m_data[0];
          dStack_388 = (pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                       super_Vector3.m_data[1];
          pSStack_380 = (pointer)(pSVar56->super_SpatialVector<iDynTree::SpatialMotionVector>).
                                 angularVec3.super_Vector3.m_data[2];
          local_5e8 = (VectorDynSize *)iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          lVar63 = iDynTree::MatrixDynSize::cols();
          sVar59 = Model::getNrOfDOFs(pMVar45);
          sVar60 = Model::getNrOfDOFs(pMVar45);
          pSVar11 = (bufs->dVb_linksAccelerations).
                    super__Vector_base<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_5a8._0_8_ = (pointer)pSVar10[LVar49].super_Matrix6x6.m_data[0];
          local_5a8._8_8_ = (pointer)pSVar10[LVar49].super_Matrix6x6.m_data[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 2;
          local_5a8._16_8_ = (double *)*pdVar55;
          local_5a8._24_8_ = (PointerType)pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 4;
          local_5a8._32_8_ = *pdVar55;
          local_5a8._40_8_ = (pointer)pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 6;
          local_5a8._48_8_ = (pointer)*pdVar55;
          local_5a8._56_8_ = pdVar55[1];
          stack0xfffffffffffffa98 =
               *(undefined1 (*) [16])(pSVar10[LVar49].super_Matrix6x6.m_data + 8);
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 10;
          local_558[0] = *pdVar55;
          local_558[1] = pdVar55[1];
          local_548 = *(undefined1 (*) [16])(pSVar10[LVar49].super_Matrix6x6.m_data + 0xc);
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0xe;
          local_538 = (LinkArticulatedBodyInertias *)*pdVar55;
          dStack_530 = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x10;
          local_528[0] = *pdVar55;
          local_528[1] = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x12;
          local_528[2] = *pdVar55;
          local_528[3] = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x14;
          local_508 = *pdVar55;
          dStack_500 = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x16;
          local_4f8[0] = *pdVar55;
          local_4f8[1] = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x18;
          local_4f8[2] = *pdVar55;
          local_4f8[3] = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1a;
          local_4d8 = *pdVar55;
          dStack_4d0 = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1c;
          local_4c8[0] = *pdVar55;
          local_4c8[1] = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x1e;
          local_4c8[2] = *pdVar55;
          local_4c8[3] = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x20;
          local_4a8 = *pdVar55;
          dStack_4a0 = pdVar55[1];
          pdVar55 = pSVar10[LVar49].super_Matrix6x6.m_data + 0x22;
          local_498[0] = *pdVar55;
          local_498[1] = pdVar55[1];
          lVar63 = (sVar61 + sVar59 + 0xc) * lVar63;
          dVar14 = *(double *)(local_5e8 + lVar63 * 8 + sVar60 * 8 + 0x30);
          dVar15 = *(double *)(local_5e8 + lVar63 * 8 + sVar60 * 8 + 0x38);
          dVar17 = *(double *)(local_5e8 + lVar63 * 8 + sVar60 * 8 + 0x40);
          dVar18 = *(double *)(local_5e8 + lVar63 * 8 + sVar60 * 8 + 0x48);
          dVar6 = *(double *)(local_5e8 + lVar63 * 8 + sVar60 * 8 + 0x50);
          dVar7 = *(double *)(local_5e8 + lVar63 * 8 + sVar60 * 8 + 0x58);
          pdVar55 = (double *)local_5a8;
          lVar63 = 0;
          do {
            pSVar8 = (&pSStack_3a0)[lVar63 + -1];
            pSVar43 = (&pSStack_3a0)[lVar63];
            *pdVar55 = *pdVar55 + dVar14 * (double)pSVar8;
            pdVar55[1] = dVar15 * (double)pSVar8 + pdVar55[1];
            pdVar55[2] = dVar17 * (double)pSVar8 + pdVar55[2];
            pdVar55[3] = dVar18 * (double)pSVar8 + pdVar55[3];
            pdVar55[4] = dVar6 * (double)pSVar8 + pdVar55[4];
            pdVar55[5] = (double)pSVar8 * dVar7 + pdVar55[5];
            pdVar55[6] = pdVar55[6] + dVar14 * (double)pSVar43;
            pdVar55[7] = dVar15 * (double)pSVar43 + pdVar55[7];
            pdVar55[8] = dVar17 * (double)pSVar43 + pdVar55[8];
            pdVar55[9] = dVar18 * (double)pSVar43 + pdVar55[9];
            pdVar55[10] = dVar6 * (double)pSVar43 + pdVar55[10];
            pdVar55[0xb] = (double)pSVar43 * dVar7 + pdVar55[0xb];
            lVar63 = lVar63 + 2;
            pdVar55 = pdVar55 + 0xc;
          } while (lVar63 != 6);
          pSVar11[LVar49].super_Matrix6x6.m_data[0] = (double)local_5a8._0_8_;
          pSVar11[LVar49].super_Matrix6x6.m_data[1] = (double)local_5a8._8_8_;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 2;
          *pdVar55 = (double)local_5a8._16_8_;
          pdVar55[1] = (double)local_5a8._24_8_;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 4;
          *pdVar55 = (double)local_5a8._32_8_;
          pdVar55[1] = (double)local_5a8._40_8_;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 6;
          *pdVar55 = (double)local_5a8._48_8_;
          pdVar55[1] = (double)local_5a8._56_8_;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 8;
          *pdVar55 = (double)local_5a8._64_8_;
          pdVar55[1] = (double)pSStack_560;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 10;
          *pdVar55 = local_558[0];
          pdVar55[1] = local_558[1];
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0xc;
          *pdVar55 = (double)local_548._0_8_;
          pdVar55[1] = (double)local_548._8_8_;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0xe;
          *pdVar55 = (double)local_538;
          pdVar55[1] = dStack_530;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x10;
          *pdVar55 = local_528[0];
          pdVar55[1] = local_528[1];
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x12;
          *pdVar55 = local_528[2];
          pdVar55[1] = local_528[3];
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x14;
          *pdVar55 = local_508;
          pdVar55[1] = dStack_500;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x16;
          *pdVar55 = local_4f8[0];
          pdVar55[1] = local_4f8[1];
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x18;
          *pdVar55 = local_4f8[2];
          pdVar55[1] = local_4f8[3];
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x1a;
          *pdVar55 = local_4d8;
          pdVar55[1] = dStack_4d0;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x1c;
          *pdVar55 = local_4c8[0];
          pdVar55[1] = local_4c8[1];
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x1e;
          *pdVar55 = local_4c8[2];
          pdVar55[1] = local_4c8[3];
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x20;
          *pdVar55 = local_4a8;
          pdVar55[1] = dStack_4a0;
          pdVar55 = pSVar11[LVar49].super_Matrix6x6.m_data + 0x22;
          *pdVar55 = local_498[0];
          pdVar55[1] = local_498[1];
          traversal = local_5d8;
        }
      }
      uVar66 = uVar66 + 1;
      uVar46 = Traversal::getNrOfVisitedLinks(traversal);
    } while (uVar66 < uVar46);
  }
  return;
}

Assistant:

void ForwardDynamicsLinearizationWrtBaseTwist(const Model& model,
                                              const Traversal& traversal,
                                              const FreeFloatingPos& robotPos,
                                              const FreeFloatingVel& robotVel,
                                              const LinkNetExternalWrenches& linkExtWrenches,
                                              const JointDOFsDoubleArray& jointTorques,
                                              ForwardDynamicsLinearizationInternalBuffers & bufs,
                                              FreeFloatingAcc& robotAcc,
                                              FreeFloatingStateLinearization& A)
{
    //std::cout << "ForwardDynamicsLinearizationWrtBaseTwist A : " << A.toString() << std::endl;
    /**
     * Forward pass: compute the derivatives of  link velocities and of link bias accelerations
     * with respect to the base twist.
     * In particur, the derivative of the linkVelocity[l] with respect to the base velocity
     * is just the \f$ ~^b X_l \f$ transform, so we just compute that transform for the derivative
     * of link velocity with respect to base velocity.
     * We don't such a strong structure for the derivative with respect to the link bias acceleration,
     * so store it as a 6x6 matrix.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // Propagate the derivatives of velocities and bias accelerations

        // If the visitedLink is the base one, initialize the derivative of the link velocity
        // with respect to the base velocity to identiy
        if( parentLink == 0 )
        {
            bufs.linkPos(visitedLinkIndex) = iDynTree::Transform::Identity();
            bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
        }
        else
        {
            LinkIndex    parentLinkIndex = parentLink->getIndex();
            bufs.linkPos(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLink->getIndex())*bufs.linkPos(parentLinkIndex);

            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
            }
            else
            {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               double dql      = robotVel.jointVel()(dofIndex);
               iDynTree::SpatialMotionVector & S = bufs.aba.S(dofIndex);

               toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]) = toEigen((S*(-dql)).asCrossProductMatrix())*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());
            }
        }

       //std::cout << " dVl_linkLocalBiasWrench : " << bufs.dVl_linkLocalBiasWrench[visitedLinkIndex].toString() << std::endl;
       toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]) = toEigen(bufs.dVl_linkLocalBiasWrench[visitedLinkIndex])*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());


    }

    /*
     * Backward pass: recursivly compute
     * the derivative of articulated body bias wrench
     * with respect to the base velocity.
     *
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);


        if( parentLink )
        {
            // For now we support only 0 and 1 dof joints
            Matrix6x6 dVb_pa;
            ArticulatedBodyInertia Ia;

            // for 1 dof joints, the articulated inertia
            // need to be propagated to the parent considering
            // the joints
            if( toParentJoint->getNrOfDOFs() > 0 )
            {
                assert(toParentJoint->getNrOfDOFs()==1);
                size_t dofIndex = toParentJoint->getDOFsOffset();

                Ia = bufs.aba.linkABIs(visitedLinkIndex)
                    - ArticulatedBodyInertia::ABADyadHelper(bufs.aba.U(dofIndex),bufs.aba.D(dofIndex));

                toEigen(bufs.dVb_u[dofIndex]) = -toEigen(bufs.aba.S(dofIndex)).transpose()*toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]);
                toEigen(dVb_pa)  =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex])
                                     + toEigen(bufs.aba.U(dofIndex))*toEigen(bufs.dVb_u[dofIndex])/bufs.aba.D(dofIndex);

            }

            // For fixed joints, we just need to propate
            // the articulated quantities without considering the
            // joint
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                Ia = bufs.aba.linkABIs(visitedLinkIndex);
                toEigen(dVb_pa)   =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
            }

            // Propagate
            LinkIndex parentLinkIndex = parentLink->getIndex();
            const Transform & parent_X_visited = toParentJoint->getTransform(robotPos.jointPos(),parentLinkIndex,visitedLinkIndex);
            toEigen(bufs.dVb_linkBiasWrench[parentLinkIndex]) += toEigen(parent_X_visited.asAdjointTransformWrench())*toEigen(dVb_pa);
        }
    }


    /**
     * Second forward pass: find robot accelerations
     *
     */
    // \todo TODO Handle gravity
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
       LinkConstPtr visitedLink = traversal.getLink(traversalEl);
       LinkIndex visitedLinkIndex = visitedLink->getIndex();
       LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
       IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

       if( parentLink == 0 )
       {
           // Preliminary step: find base acceleration
           //std::cout << "bufs.dVb_linkBiasWrench : "<<  bufs.dVb_linkBiasWrench[visitedLinkIndex].toString() << std::endl;
           toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = -toEigen(bufs.aba.linkABIs(visitedLinkIndex).asMatrix()).householderQr().solve(toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]));
           // Start storing the result in the linearization matrix
           toEigen(A).block<6,6>(6+model.getNrOfDOFs(),6+model.getNrOfDOFs()) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]);
           /*
           std::cout << "Acceleration setted : " << std::endl;
           std::cout << toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) << std::endl;
           std::cout << "Resulting A " << std::endl;
           */
        }
       else
       {
           LinkIndex    parentLinkIndex = parentLink->getIndex();
           if( toParentJoint->getNrOfDOFs() > 0 )
           {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               assert(toParentJoint->getNrOfDOFs()==1);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
               toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs())  = (toEigen(bufs.dVb_u[dofIndex]) - toEigen(bufs.aba.U(dofIndex)).transpose()*toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]))/bufs.aba.D(dofIndex);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) + toEigen(bufs.aba.S(dofIndex))*toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs());
           }
           else
           {
               //for fixed joints we just propagate the acceleration
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
           }
       }
    }
}